

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O0

CURLcode Curl_cf_unix_create(Curl_cfilter **pcf,Curl_easy *data,connectdata *conn,Curl_addrinfo *ai,
                            int transport)

{
  Curl_cfilter *local_50;
  CURLcode local_44;
  Curl_cfilter *pCStack_40;
  CURLcode result;
  Curl_cfilter *cf;
  cf_socket_ctx *ctx;
  Curl_addrinfo *pCStack_28;
  int transport_local;
  Curl_addrinfo *ai_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  Curl_cfilter **pcf_local;
  
  cf = (Curl_cfilter *)0x0;
  pCStack_40 = (Curl_cfilter *)0x0;
  ctx._4_4_ = transport;
  pCStack_28 = ai;
  ai_local = (Curl_addrinfo *)conn;
  conn_local = (connectdata *)data;
  data_local = (Curl_easy *)pcf;
  cf = (Curl_cfilter *)(*Curl_ccalloc)(1,0x138);
  if ((cf_socket_ctx *)cf == (cf_socket_ctx *)0x0) {
    local_44 = CURLE_OUT_OF_MEMORY;
  }
  else {
    local_44 = cf_socket_ctx_init((cf_socket_ctx *)cf,pCStack_28,ctx._4_4_);
    if (local_44 == CURLE_OK) {
      local_44 = Curl_cf_create(&stack0xffffffffffffffc0,&Curl_cft_unix,cf);
    }
  }
  if (local_44 == CURLE_OK) {
    local_50 = pCStack_40;
  }
  else {
    local_50 = (Curl_cfilter *)0x0;
  }
  *(Curl_cfilter **)data_local = local_50;
  if (local_44 != CURLE_OK) {
    (*Curl_cfree)(pCStack_40);
    pCStack_40 = (Curl_cfilter *)0x0;
    (*Curl_cfree)(cf);
  }
  return local_44;
}

Assistant:

CURLcode Curl_cf_unix_create(struct Curl_cfilter **pcf,
                             struct Curl_easy *data,
                             struct connectdata *conn,
                             const struct Curl_addrinfo *ai,
                             int transport)
{
  struct cf_socket_ctx *ctx = NULL;
  struct Curl_cfilter *cf = NULL;
  CURLcode result;

  (void)data;
  (void)conn;
  DEBUGASSERT(transport == TRNSPRT_UNIX);
  ctx = calloc(1, sizeof(*ctx));
  if(!ctx) {
    result = CURLE_OUT_OF_MEMORY;
    goto out;
  }

  result = cf_socket_ctx_init(ctx, ai, transport);
  if(result)
    goto out;

  result = Curl_cf_create(&cf, &Curl_cft_unix, ctx);

out:
  *pcf = (!result) ? cf : NULL;
  if(result) {
    Curl_safefree(cf);
    Curl_safefree(ctx);
  }

  return result;
}